

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O1

void __thiscall
optimization::global_expr_move::Global_Expr_Mov::optimize_func
          (Global_Expr_Mov *this,MirFunction *func)

{
  uint32_t uVar1;
  undefined4 uVar2;
  _Rb_tree_color _Var3;
  element_type *peVar4;
  pair<int,_int> *ppVar5;
  undefined8 *******pppppppuVar6;
  undefined8 *******pppppppuVar7;
  uint32_t *__v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *this_00;
  uint uVar8;
  pair<int,_int> pVar9;
  pair<int,_int> pVar10;
  undefined8 uVar11;
  pair<int,_int> pVar12;
  int iVar13;
  uint uVar14;
  mapped_type *pmVar15;
  iterator __position;
  _Base_ptr p_Var16;
  long lVar17;
  _List_node_base *p_Var18;
  mapped_type *pmVar19;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar20;
  mapped_type *pmVar21;
  mapped_type *pmVar22;
  __uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> _Var23;
  iterator iVar24;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_01;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var25;
  int *piVar26;
  __uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> _Var27;
  _Rb_tree_node_base *p_Var28;
  _Rb_tree_header *p_Var29;
  _Base_ptr p_Var30;
  _Rb_tree_header *p_Var31;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *pmVar32;
  ulong uVar33;
  _Base_ptr p_Var34;
  Tag *tag;
  char *function;
  _Head_base<0UL,_mir::inst::Inst_*,_false> _Var35;
  MirFunction *func_00;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *pmVar36;
  char cVar37;
  bool bVar38;
  pair<std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_bool>
  pVar39;
  int id_1;
  value_type start;
  list<int,_std::allocator<int>_> queue;
  pair<int,_int> point;
  LoadOp op;
  LabelId id;
  mapped_type var;
  mapped_type var_1;
  _Self __tmp;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  Var_Replace vp;
  Livevar_Analyse lva;
  uint local_4d4;
  uint local_4d0;
  ostream local_4c9;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *local_4c8;
  mapped_type *local_4c0;
  uint local_4b4;
  undefined8 *******local_4b0;
  undefined8 *******local_4a8;
  long local_4a0;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *local_498;
  pair<int,_int> local_490;
  Global_Expr_Mov *local_488;
  undefined8 local_480;
  pair<int,_int> local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *local_460;
  undefined1 local_458 [40];
  pair<int,_int> local_430;
  undefined **local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  size_t local_410;
  bool local_408;
  pair<int,_int> local_3f8;
  undefined **local_3f0;
  undefined1 local_3e8;
  undefined7 uStack_3e7;
  undefined8 uStack_3e0;
  MirFunction *local_3d8;
  undefined **local_3d0;
  mapped_type *local_3c8;
  undefined1 local_3c0 [16];
  undefined8 local_3b0;
  undefined1 local_3a8;
  undefined7 uStack_3a7;
  undefined1 local_398;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  __index_type local_370;
  undefined2 local_36f;
  pair<int,_int> local_368;
  undefined1 local_360 [24];
  undefined **local_348;
  undefined1 local_340 [40];
  undefined **local_318;
  pair<int,_int> local_310;
  undefined1 local_308 [32];
  undefined1 local_2e8 [24];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_2d0;
  VarId local_2a0;
  VarId local_290;
  VarId local_280;
  VarId local_270;
  undefined **local_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined1 local_248 [48];
  undefined **local_218;
  undefined4 local_210;
  __index_type local_200;
  undefined1 local_1f8 [56];
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
  local_1c0;
  Livevar_Analyse local_190;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_120;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_d0;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_80;
  
  if (((func->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      is_extern == false) {
    p_Var34 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_340._8_8_ = &(func->basic_blks)._M_t._M_impl.super__Rb_tree_header;
    local_488 = this;
    local_3d8 = func;
    if (p_Var34 != (_Base_ptr)local_340._8_8_) {
      local_4c8 = &func->variables;
      p_Var16 = p_Var34;
      do {
        __position._M_current =
             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
             p_Var16[3]._M_parent;
        do {
          if ((_Base_ptr)__position._M_current == p_Var16[3]._M_left) break;
          iVar13 = (*((((__position._M_current)->_M_t).
                       super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                       .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                     super_Displayable)._vptr_Displayable[1])();
          if (iVar13 == 2) {
            bVar38 = *(int *)&p_Var16[1]._M_left != *(int *)&p_Var34[1]._M_left;
            if (bVar38) {
              pmVar15 = std::
                        map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                        ::at(local_4c8,
                             &((((__position._M_current)->_M_t).
                                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest
                              ).id);
              pmVar15->is_temp_var = false;
              std::
              vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                        ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                          *)&p_Var34[3]._M_parent,__position._M_current);
              __position = std::
                           vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                           ::_M_erase((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                       *)&p_Var16[3]._M_parent,__position);
            }
          }
          else {
            __position._M_current = __position._M_current + 1;
            bVar38 = true;
          }
        } while (bVar38);
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
      } while (p_Var16 != (_Base_ptr)local_340._8_8_);
    }
    local_460 = &local_3d8->basic_blks;
    local_340._16_8_ = &local_488->offset;
    local_498 = &local_3d8->variables;
    local_318 = &PTR_display_001f0078;
    local_490 = (pair<int,_int>)&PTR_display_001effc8;
    local_3d0 = &PTR_display_001f0018;
    local_340._32_8_ = &PTR_display_001f0258;
    func_00 = local_3d8;
    do {
      livevar_analyse::Livevar_Analyse::Livevar_Analyse(&local_190,func_00,false);
      livevar_analyse::Livevar_Analyse::build(&local_190);
      var_replace::Var_Replace::Var_Replace((Var_Replace *)local_1f8,func_00);
      local_458._0_8_ = (Env *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<optimization::global_expr_move::Env,std::allocator<optimization::global_expr_move::Env>,mir::inst::MirFunction&,optimization::livevar_analyse::Livevar_Analyse&,optimization::var_replace::Var_Replace&,bool&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_458 + 8),(Env **)local_458,
                 (allocator<optimization::global_expr_move::Env> *)local_390,func_00,&local_190,
                 (Var_Replace *)local_1f8,(bool *)local_340._16_8_);
      uVar11 = local_458._8_8_;
      env = (_func_int **)local_458._0_8_;
      this_00 = DAT_001f14e8;
      local_458._0_8_ = (Env *)0x0;
      local_458._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      DAT_001f14e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)uVar11;
      p_Var31 = &local_2d0._M_impl.super__Rb_tree_header;
      if (this_00 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._8_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_458._8_8_);
      }
      local_4a0 = 0;
      local_2d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_2d0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_4b0 = &local_4b0;
      local_4a8 = &local_4b0;
      local_2d0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var31->_M_header;
      local_2d0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var31->_M_header;
      lVar17 = std::_Rb_tree_decrement((_Rb_tree_node_base *)local_340._8_8_);
      p_Var18 = (_List_node_base *)operator_new(0x18);
      *(undefined4 *)&p_Var18[1]._M_next = *(undefined4 *)(lVar17 + 0x20);
      std::__detail::_List_node_base::_M_hook(p_Var18);
      local_4a0 = local_4a0 + 1;
      if ((undefined8 ********)local_4b0 == &local_4b0) {
        local_4b4 = 0;
      }
      else {
        local_4b4 = 0;
        pmVar32 = local_498;
        do {
          pppppppuVar7 = local_4b0;
          local_4d0 = *(uint *)(local_4b0 + 2);
          local_4a0 = local_4a0 + -1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(pppppppuVar7,0x18);
          p_Var31 = &local_2d0._M_impl.super__Rb_tree_header;
          p_Var16 = &p_Var31->_M_header;
          for (p_Var34 = local_2d0._M_impl.super__Rb_tree_header._M_header._M_parent;
              (_Rb_tree_header *)p_Var34 != (_Rb_tree_header *)0x0;
              p_Var34 = (&p_Var34->_M_left)[(int)*(size_t *)(p_Var34 + 1) < (int)local_4d0]) {
            if ((int)local_4d0 <= (int)*(size_t *)(p_Var34 + 1)) {
              p_Var16 = p_Var34;
            }
          }
          p_Var29 = p_Var31;
          if (((_Rb_tree_header *)p_Var16 != p_Var31) &&
             (p_Var29 = (_Rb_tree_header *)p_Var16,
             (int)local_4d0 < (int)((_Rb_tree_header *)p_Var16)->_M_node_count)) {
            p_Var29 = p_Var31;
          }
          if (p_Var29 == p_Var31) {
            pmVar19 = std::
                      map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                      ::at(local_460,(key_type *)&local_4d0);
            local_3c8 = std::
                        map<int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<optimization::livevar_analyse::Block_Live_Var>_>_>_>
                        ::operator[](&local_190.livevars,(key_type *)&local_4d0);
            pmVar36 = (map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                       *)(pmVar19->inst).
                         super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            local_4c0 = pmVar19;
            if (pmVar36 !=
                (map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                 *)(pmVar19->inst).
                   super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                pmVar15 = std::
                          map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                          ::at(pmVar32,(key_type_conflict *)
                                       ((long)*(tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                                *)&(pmVar36->_M_t)._M_impl + 0x10));
                if (pmVar15->is_phi_var == true) goto LAB_00131311;
                iVar13 = (**(code **)(*(long *)*(tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                                 *)&(pmVar36->_M_t)._M_impl + 8))();
                _Var35._M_head_impl = *(Inst **)&(pmVar36->_M_t)._M_impl;
                if (iVar13 == 1) {
                  if (*(undefined ***)_Var35._M_head_impl != local_318) {
                    _Var35._M_head_impl = (Inst *)0x0;
                  }
                  if ((*(char *)&_Var35._M_head_impl[2].super_Displayable._vptr_Displayable == '\0')
                     && (*(char *)&_Var35._M_head_impl[3].dest.super_Displayable._vptr_Displayable
                         == '\0')) {
                    bVar38 = true;
                  }
                  else {
                    local_4d4 = 0xffffffff;
                    uVar1 = _Var35._M_head_impl[3].dest.id;
                    local_340._24_8_ = &_Var35._M_head_impl[1].dest;
                    local_2e8[0x10] =
                         *(__index_type *)
                          &_Var35._M_head_impl[2].super_Displayable._vptr_Displayable;
                    local_458._0_8_ = local_2e8;
                    local_4c8 = pmVar36;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr[(long)(char)local_2e8[0x10] + 1]._M_data)
                              ((anon_class_8_1_a78179b7_conflict *)local_458,
                               (variant<int,_mir::inst::VarId> *)local_340._24_8_);
                    pVar9 = local_490;
                    local_308._24_4_ = local_490.first;
                    local_308._28_4_ = local_490.second;
                    local_2e8._17_2_ =
                         *(undefined2 *)
                          ((long)&_Var35._M_head_impl[2].super_Displayable._vptr_Displayable + 1);
                    __v = &_Var35._M_head_impl[2].dest.id;
                    local_308[0x10] =
                         *(__index_type *)
                          &_Var35._M_head_impl[3].dest.super_Displayable._vptr_Displayable;
                    local_458._0_8_ = local_308;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr[(long)(char)local_308[0x10] + 1]._M_data)
                              ((anon_class_8_1_a78179b7_conflict *)local_458,
                               (variant<int,_mir::inst::VarId> *)__v);
                    local_310 = pVar9;
                    local_308._17_2_ =
                         *(undefined2 *)
                          ((long)&_Var35._M_head_impl[3].dest.super_Displayable._vptr_Displayable +
                          1);
                    local_390._0_4_ = uVar1;
                    local_370 = local_2e8[0x10];
                    local_458._0_8_ = local_380;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr[(long)(char)local_2e8[0x10] + 1]._M_data)
                              ((anon_class_8_1_a78179b7_conflict *)local_458,
                               (variant<int,_mir::inst::VarId> *)local_2e8);
                    pVar10 = local_490;
                    local_490.first = pVar9.first;
                    local_490.second = pVar9.second;
                    local_390._8_4_ = local_490.first;
                    local_390._12_4_ = local_490.second;
                    local_36f = local_2e8._17_2_;
                    local_360[0x10] = local_308[0x10];
                    local_458._0_8_ = local_360;
                    local_490 = pVar10;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr[(long)(char)local_308[0x10] + 1]._M_data)
                              ((anon_class_8_1_a78179b7_conflict *)local_458,
                               (variant<int,_mir::inst::VarId> *)local_308);
                    local_368 = pVar9;
                    local_360._17_2_ = local_308._17_2_;
                    cVar37 = *(char *)&_Var35._M_head_impl[2].super_Displayable._vptr_Displayable;
                    if (cVar37 == '\0') {
LAB_00130be7:
                      if (*(char *)&_Var35._M_head_impl[3].dest.super_Displayable._vptr_Displayable
                          != '\0') {
                        pvVar20 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)__v);
                        uVar8 = local_4d0;
                        uVar14 = pvVar20->id;
                        peVar4 = (((local_3c8->
                                   super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->live_vars_in).
                                 super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                        p_Var31 = &(peVar4->_M_t)._M_impl.super__Rb_tree_header;
                        p_Var34 = (peVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                        p_Var16 = &p_Var31->_M_header;
                        for (; p_Var34 != (_Base_ptr)0x0; p_Var34 = (&p_Var34->_M_left)[bVar38]) {
                          bVar38 = *(uint *)&p_Var34[1]._M_parent < uVar14;
                          if (!bVar38) {
                            p_Var16 = p_Var34;
                          }
                        }
                        p_Var34 = &p_Var31->_M_header;
                        if (((_Rb_tree_header *)p_Var16 != p_Var31) &&
                           (p_Var34 = p_Var16, uVar14 < *(uint *)&p_Var16[1]._M_parent)) {
                          p_Var34 = &p_Var31->_M_header;
                        }
                        if ((_Rb_tree_header *)p_Var34 == p_Var31) {
                          iVar13 = 0xc;
                          pmVar19 = local_4c0;
                          goto LAB_001312fd;
                        }
                        std::__detail::__variant::
                        _Uninitialized<optimization::global_expr_move::Op,true>::
                        _Uninitialized<optimization::global_expr_move::Op&>
                                  ((_Uninitialized<optimization::global_expr_move::Op,true> *)
                                   &local_120,local_390);
                        local_120.
                        super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        ._M_index = '\0';
                        local_4d4 = bfs(local_488,uVar8,&local_120);
                      }
LAB_00130cd0:
                      iVar13 = 0xc;
                      pmVar19 = local_4c0;
                      if (local_4d4 != local_4d0) {
                        pmVar21 = std::
                                  map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                                  ::at((map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                                        *)(env + 2),(key_type *)&local_4d4);
                        iVar24 = std::
                                 _Hashtable<optimization::global_expr_move::Op,_std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<optimization::global_expr_move::Op>,_optimization::global_expr_move::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 ::find((_Hashtable<optimization::global_expr_move::Op,_std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<optimization::global_expr_move::Op>,_optimization::global_expr_move::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                         *)pmVar21,(key_type *)local_390);
                        if (iVar24.
                            super__Node_iterator_base<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_true>
                            ._M_cur == (__node_type *)0x0) {
                          std::__throw_out_of_range("_Map_base::at");
                        }
                        local_348 = &PTR_display_001ee058;
                        local_340._0_4_ =
                             *(uint32_t *)
                              ((long)iVar24.
                                     super__Node_iterator_base<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_true>
                                     ._M_cur + 0x58);
                        tag = (Tag *)local_340;
                        pmVar15 = std::
                                  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  ::at(local_498,(key_type_conflict *)tag);
                        if (pmVar15->is_phi_var == true) {
                          uVar2 = *(undefined4 *)
                                   ((long)*(tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                            *)&(local_4c8->_M_t)._M_impl + 0x10);
                          uVar33 = (ulong)local_4d4;
                          pmVar19 = std::
                                    map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                    ::at(local_460,(key_type *)&local_4d4);
                          local_458._0_8_ = &PTR_display_001ee058;
                          local_458._8_4_ = uVar2;
                          local_458._16_8_ =
                               ((long)(pmVar19->inst).
                                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pmVar19->inst).
                                      super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start &
                               0xfffffffffffffff8U) << 0x1d | uVar33;
                          pVar39 = std::
                                   _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::pair<int,int>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::pair<int,int>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::pair<int,int>>>>
                                   ::
                                   _M_insert_unique<std::pair<mir::inst::VarId_const,std::pair<int,int>>>
                                             ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::pair<int,int>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::pair<int,int>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::pair<int,int>>>>
                                               *)&local_1c0,
                                              (pair<const_mir::inst::VarId,_std::pair<int,_int>_> *)
                                              local_458);
                          _Var27._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
                               *(tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> *)
                                &(local_4c8->_M_t)._M_impl;
                          (**(code **)(*(long *)_Var27._M_t.
                                                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                                .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                                _M_head_impl + 0x10))
                                    (local_458,
                                     _Var27._M_t.
                                     super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                     .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl,
                                     pVar39._8_8_);
                          p_Var28 = (_Rb_tree_node_base *)local_458._24_8_;
                          if ((_Rb_tree_node_base *)local_458._24_8_ !=
                              (_Rb_tree_node_base *)(local_458 + 8)) {
                            do {
                              local_3c0._0_8_ = &PTR_display_001ee058;
                              local_3c0._8_4_ = *(undefined4 *)&p_Var28[1]._M_parent;
                              this_01 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>
                                         *)std::
                                           map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                                           ::at((map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                                                 *)(local_1f8 + 8),(key_type *)local_3c0);
                              local_480 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT44((int)((ulong)((long)local_4c8 -
                                                                   (long)(local_4c0->inst).
                                                                                                                                                  
                                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
                                                  local_4c0->id);
                              _Var25 = std::
                                       __find_if<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::pair<int,int>const>>
                                                 (*(undefined8 *)this_01,
                                                  *(undefined8 *)(this_01 + 8),(string *)&local_480)
                              ;
                              ppVar5 = *(pair<int,_int> **)(this_01 + 8);
                              if (_Var25._M_current != ppVar5) {
                                if ((_Var25._M_current + 1 != ppVar5) &&
                                   (lVar17 = (long)ppVar5 - (long)(_Var25._M_current + 1) >> 3,
                                   0 < lVar17)) {
                                  lVar17 = lVar17 + 1;
                                  piVar26 = &_Var25._M_current[1].second;
                                  do {
                                    *(pair<int,_int> *)(piVar26 + -3) =
                                         *(pair<int,_int> *)(piVar26 + -1);
                                    lVar17 = lVar17 + -1;
                                    piVar26 = piVar26 + 2;
                                  } while (1 < lVar17);
                                }
                                *(pair<int,_int> **)(this_01 + 8) = ppVar5 + -1;
                                pmVar19 = std::
                                          map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                          ::at(local_460,(key_type *)&local_4d4);
                                local_3f8.second =
                                     (int)((ulong)((long)(pmVar19->inst).
                                                                                                                  
                                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pmVar19->inst).
                                                                                                                
                                                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
                                local_3f8.first = local_4d4;
                                std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
                                emplace_back<std::pair<int,int>>(this_01,&local_3f8);
                              }
                              p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28);
                            } while (p_Var28 != (_Rb_tree_node_base *)(local_458 + 8));
                          }
                          std::
                          _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                          ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                                       *)local_458);
                          pmVar19 = std::
                                    map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                                    ::at(local_460,(key_type *)&local_4d4);
                          std::
                          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                          ::
                          emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                                    ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                                      *)&pmVar19->inst,
                                     (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                                      *)local_4c8);
                          _Var27._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
                               (tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
                               operator_new(0x38);
                          *(undefined ***)
                           ((long)_Var27._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8)
                               = &PTR_display_001ee058;
                          *(undefined4 *)
                           ((long)_Var27._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl +
                           0x10) = 0xffffffff;
                          *(undefined ***)
                           _Var27._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = local_3d0
                          ;
                          *(undefined1 *)
                           ((long)_Var27._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl +
                           0x30) = 0;
                          *(undefined4 *)
                           ((long)_Var27._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl +
                           0x20) = 0xffffffff;
                          *(pair<int,_int> *)
                           ((long)_Var27._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl +
                           0x18) = local_490;
                          *(undefined2 *)
                           ((long)_Var27._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl +
                           0x31) = 1;
                          _Var35._M_head_impl = *(Inst **)&(local_4c8->_M_t)._M_impl;
                          *(tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> *)
                           &(local_4c8->_M_t)._M_impl =
                               _Var27._M_t.
                               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                               .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                        }
                        else {
                          local_4c9 = (ostream)0x0;
                          AixLog::operator<<(&local_4c9,(Severity *)tag);
                          local_3c0._0_8_ = &PTR__Tag_001edee0;
                          local_3c0._8_8_ = &local_3a8;
                          local_3b0 = 0;
                          local_3a8 = 0;
                          local_398 = 1;
                          AixLog::operator<<((ostream *)local_3c0,tag);
                          local_258 = std::chrono::_V2::system_clock::now();
                          local_260 = &PTR__Timestamp_001edeb0;
                          local_250 = 0;
                          AixLog::operator<<((ostream *)&local_260,(Timestamp *)tag);
                          local_480 = &local_470;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_480,"optimize_func","");
                          local_3f8 = (pair<int,_int>)&local_3e8;
                          function = 
                          "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/global_expression_move.hpp"
                          ;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_3f8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/global_expression_move.hpp"
                                     ,"");
                          pmVar32 = local_4c8;
                          local_458._0_8_ = &PTR__Function_001edf10;
                          if (local_480 == &local_470) {
                            local_458._32_8_ = local_470._8_8_;
                            local_458._8_8_ =
                                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)(local_458 + 0x18);
                          }
                          else {
                            local_458._8_8_ = local_480;
                          }
                          local_458._25_7_ = local_470._M_allocated_capacity._1_7_;
                          local_458[0x18] = local_470._M_local_buf[0];
                          local_458._16_4_ = local_478.first;
                          local_458._20_4_ = local_478.second;
                          local_478.first = 0;
                          local_478.second = 0;
                          local_470._M_local_buf[0] = '\0';
                          local_430 = (pair<int,_int>)&local_420;
                          if (local_3f8 == (pair<int,_int>)&local_3e8) {
                            local_420._8_8_ = uStack_3e0;
                          }
                          else {
                            local_430 = local_3f8;
                          }
                          local_420._M_allocated_capacity._1_7_ = uStack_3e7;
                          local_420._M_local_buf[0] = local_3e8;
                          local_428 = local_3f0;
                          local_3f0 = (undefined **)0x0;
                          local_3e8 = 0;
                          local_410 = 0x161;
                          local_408 = false;
                          local_480 = &local_470;
                          local_3f8 = (pair<int,_int>)&local_3e8;
                          AixLog::operator<<((ostream *)local_458,(Function *)function);
                          _Var27._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
                               *(tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> *)
                                &(pmVar32->_M_t)._M_impl;
                          (*(code *)**(undefined8 **)
                                      ((long)_Var27._M_t.
                                             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                             .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                             _M_head_impl + 8))
                                    ((long)_Var27._M_t.
                                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                           _M_head_impl + 8,&std::clog);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::clog," is replaced to ",0x10);
                          (*(code *)*local_348)(&local_348,&std::clog);
                          std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
                          std::ostream::put(-0x80);
                          std::ostream::flush();
                          AixLog::Function::~Function((Function *)local_458);
                          if (local_3f8 != (pair<int,_int>)&local_3e8) {
                            operator_delete((void *)local_3f8,CONCAT71(uStack_3e7,local_3e8) + 1);
                          }
                          if (local_480 != &local_470) {
                            operator_delete(local_480,
                                            CONCAT71(local_470._M_allocated_capacity._1_7_,
                                                     local_470._M_local_buf[0]) + 1);
                          }
                          local_3c0._0_8_ = &PTR__Tag_001edee0;
                          if ((undefined1 *)local_3c0._8_8_ != &local_3a8) {
                            operator_delete((void *)local_3c0._8_8_,
                                            CONCAT71(uStack_3a7,local_3a8) + 1);
                          }
                          local_270.super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001ee058;
                          local_270.id = *(uint32_t *)
                                          ((long)*(
                                                  tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                                  *)&(pmVar32->_M_t)._M_impl + 0x10);
                          local_280.super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001ee058;
                          local_280.id = local_340._0_4_;
                          var_replace::Var_Replace::replace
                                    ((Var_Replace *)local_1f8,&local_270,&local_280);
                          pmVar32 = local_4c8;
                          _Var27._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
                               *(tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> *)
                                &(local_4c8->_M_t)._M_impl;
                          _Var23._M_t.
                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
                               (tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
                               operator_new(0x38);
                          uVar2 = *(undefined4 *)
                                   ((long)_Var27._M_t.
                                          super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                          .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                          _M_head_impl + 0x10);
                          *(undefined ***)
                           ((long)_Var23._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8)
                               = &PTR_display_001ee058;
                          *(undefined4 *)
                           ((long)_Var23._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl +
                           0x10) = uVar2;
                          *(undefined ***)
                           _Var23._M_t.
                           super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                           .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = local_3d0
                          ;
                          *(undefined1 *)
                           ((long)_Var23._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl +
                           0x30) = 0;
                          *(undefined4 *)
                           ((long)_Var23._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl +
                           0x20) = 0xfffffc19;
                          *(pair<int,_int> *)
                           ((long)_Var23._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl +
                           0x18) = local_490;
                          *(undefined2 *)
                           ((long)_Var23._M_t.
                                  super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                  .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl +
                           0x31) = 1;
                          _Var35._M_head_impl = *(Inst **)&(pmVar32->_M_t)._M_impl;
                          *(tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> *)
                           &(pmVar32->_M_t)._M_impl =
                               _Var23._M_t.
                               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                               .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                        }
                        pmVar32 = local_498;
                        pmVar19 = local_4c0;
                        if ((_Head_base<0UL,_mir::inst::Inst_*,_false>)_Var35._M_head_impl !=
                            (_Head_base<0UL,_mir::inst::Inst_*,_false>)0x0) {
                          (*((_Var35._M_head_impl)->super_Displayable)._vptr_Displayable[5])();
                        }
                        local_458._0_4_ = local_340._0_4_;
                        pmVar15 = std::
                                  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  ::at(pmVar32,(key_type_conflict *)local_458);
                        pmVar15->is_temp_var = false;
                        iVar13 = 0xb;
                        local_4b4 = (uint)CONCAT71((int7)((ulong)pmVar15 >> 8),1);
                      }
                    }
                    else {
                      if (*(char *)&_Var35._M_head_impl[3].dest.super_Displayable._vptr_Displayable
                          == '\0') {
                        if (cVar37 == '\0') goto LAB_00130be7;
                        pvVar20 = std::get<1ul,int,mir::inst::VarId>
                                            ((variant<int,_mir::inst::VarId> *)local_340._24_8_);
                        uVar8 = local_4d0;
                        uVar14 = pvVar20->id;
                        peVar4 = (((local_3c8->
                                   super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr)->live_vars_in).
                                 super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                        p_Var31 = &(peVar4->_M_t)._M_impl.super__Rb_tree_header;
                        p_Var34 = (peVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                        p_Var16 = &p_Var31->_M_header;
                        for (; p_Var34 != (_Base_ptr)0x0; p_Var34 = (&p_Var34->_M_left)[bVar38]) {
                          bVar38 = *(uint *)&p_Var34[1]._M_parent < uVar14;
                          if (!bVar38) {
                            p_Var16 = p_Var34;
                          }
                        }
                        p_Var34 = &p_Var31->_M_header;
                        if (((_Rb_tree_header *)p_Var16 != p_Var31) &&
                           (p_Var34 = p_Var16, uVar14 < *(uint *)&p_Var16[1]._M_parent)) {
                          p_Var34 = &p_Var31->_M_header;
                        }
                        if ((_Rb_tree_header *)p_Var34 == p_Var31) {
                          iVar13 = 0xc;
                          pmVar19 = local_4c0;
                          goto LAB_001312fd;
                        }
                        std::__detail::__variant::
                        _Uninitialized<optimization::global_expr_move::Op,true>::
                        _Uninitialized<optimization::global_expr_move::Op&>
                                  ((_Uninitialized<optimization::global_expr_move::Op,true> *)
                                   &local_d0,local_390);
                        local_d0.
                        super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        ._M_index = '\0';
                        local_4d4 = bfs(local_488,uVar8,&local_d0);
                        goto LAB_00130cd0;
                      }
                      pvVar20 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)local_340._24_8_);
                      uVar14 = pvVar20->id;
                      pvVar20 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)__v);
                      uVar8 = local_4d0;
                      peVar4 = (((local_3c8->
                                 super___shared_ptr<optimization::livevar_analyse::Block_Live_Var,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->live_vars_in).
                               super___shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr;
                      p_Var31 = &(peVar4->_M_t)._M_impl.super__Rb_tree_header;
                      p_Var34 = (peVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                      p_Var16 = p_Var34;
                      p_Var30 = &p_Var31->_M_header;
                      for (; p_Var16 != (_Base_ptr)0x0; p_Var16 = (&p_Var16->_M_left)[bVar38]) {
                        bVar38 = *(uint *)&p_Var16[1]._M_parent < uVar14;
                        if (!bVar38) {
                          p_Var30 = p_Var16;
                        }
                      }
                      p_Var16 = &p_Var31->_M_header;
                      if (((_Rb_tree_header *)p_Var30 != p_Var31) &&
                         (p_Var16 = p_Var30, uVar14 < *(uint *)&p_Var30[1]._M_parent)) {
                        p_Var16 = &p_Var31->_M_header;
                      }
                      iVar13 = 0xc;
                      if ((_Rb_tree_header *)p_Var16 == p_Var31) {
LAB_00130b24:
                        bVar38 = false;
                      }
                      else {
                        uVar14 = pvVar20->id;
                        p_Var16 = &p_Var31->_M_header;
                        for (; p_Var34 != (_Base_ptr)0x0; p_Var34 = (&p_Var34->_M_left)[bVar38]) {
                          bVar38 = *(uint *)&p_Var34[1]._M_parent < uVar14;
                          if (!bVar38) {
                            p_Var16 = p_Var34;
                          }
                        }
                        p_Var34 = &p_Var31->_M_header;
                        if (((_Rb_tree_header *)p_Var16 != p_Var31) &&
                           (p_Var34 = p_Var16, uVar14 < *(uint *)&p_Var16[1]._M_parent)) {
                          p_Var34 = &p_Var31->_M_header;
                        }
                        if ((_Rb_tree_header *)p_Var34 == p_Var31) goto LAB_00130b24;
                        std::__detail::__variant::
                        _Uninitialized<optimization::global_expr_move::Op,true>::
                        _Uninitialized<optimization::global_expr_move::Op&>
                                  ((_Uninitialized<optimization::global_expr_move::Op,true> *)
                                   &local_80,local_390);
                        local_80.
                        super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        .
                        super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                        ._M_index = '\0';
                        local_4d4 = bfs(local_488,uVar8,&local_80);
                        iVar13 = 0;
                        bVar38 = true;
                      }
                      pmVar19 = local_4c0;
                      if (bVar38) goto LAB_00130cd0;
                    }
LAB_001312fd:
                    bVar38 = iVar13 == 0xc;
                    pmVar32 = local_498;
                    pmVar36 = local_4c8;
                  }
                  if (bVar38) goto LAB_00131311;
                }
                else {
                  if ((iVar13 == 3) && (*(bool *)local_340._16_8_ == true)) {
                    if (*(Var_Replace **)_Var35._M_head_impl != (Var_Replace *)local_340._32_8_) {
                      _Var35._M_head_impl = (Inst *)0x0;
                    }
                    local_4c8 = pmVar36;
                    pvVar20 = std::get<1ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)
                                         &_Var35._M_head_impl[1].dest);
                    local_390._0_8_ = &PTR_display_001ee058;
                    local_390._8_4_ = pvVar20->id;
                    cVar37 = *(char *)&_Var35._M_head_impl[3].dest.super_Displayable.
                                       _vptr_Displayable;
                    local_368 = (pair<int,_int>)CONCAT71(local_368._1_7_,cVar37);
                    local_3c0._0_8_ = local_380 + 8;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr[(long)cVar37 + 1]._M_data)
                              ((anon_class_8_1_a78179b7_conflict *)local_3c0,
                               (variant<int,_mir::inst::VarId> *)&_Var35._M_head_impl[2].dest.id);
                    local_380._0_4_ = local_490.first;
                    local_380._4_4_ = local_490.second;
                    local_368.first._1_2_ =
                         *(undefined2 *)
                          ((long)&_Var35._M_head_impl[3].dest.super_Displayable._vptr_Displayable +
                          1);
                    local_458._0_8_ = &PTR_display_001ee058;
                    local_458._8_4_ = local_390._8_4_;
                    local_430.first._0_1_ = (undefined1)local_368.first;
                    local_3c0._0_8_ = local_458 + 0x18;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr[(long)(char)(undefined1)local_368.first + 1]._M_data)
                              ((anon_class_8_1_a78179b7_conflict *)local_3c0,
                               (variant<int,_mir::inst::VarId> *)(local_380 + 8));
                    pVar9 = local_490;
                    uVar14 = local_4d0;
                    local_458._16_4_ = local_490.first;
                    local_458._20_4_ = local_490.second;
                    local_430.first._1_2_ = local_368.first._1_2_;
                    local_428 = &PTR_display_001ee058;
                    local_420._M_allocated_capacity._0_4_ = ((_Var35._M_head_impl)->dest).id;
                    local_248._0_8_ = &PTR_display_001ee058;
                    local_248._8_4_ = local_458._8_4_;
                    local_248[0x28] = (undefined1)local_430.first;
                    local_390._0_8_ = local_248 + 0x18;
                    (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
                      ::_S_vtable._M_arr[(long)(char)(undefined1)local_430.first + 1]._M_data)
                              ((anon_class_8_1_a78179b7_conflict *)local_390,
                               (variant<int,_mir::inst::VarId> *)(local_458 + 0x18));
                    pVar12 = local_430;
                    pVar10 = local_490;
                    local_490.first = pVar9.first;
                    local_490.second = pVar9.second;
                    local_248._16_4_ = local_490.first;
                    local_248._20_4_ = local_490.second;
                    local_248[0x29] = local_430.first._1_1_;
                    local_248[0x2a] = local_430.first._2_1_;
                    local_218 = &PTR_display_001ee058;
                    local_210 = local_420._M_allocated_capacity._0_4_;
                    local_200 = '\x01';
                    local_490 = pVar10;
                    local_430 = pVar12;
                    uVar14 = bfs(local_488,uVar14,
                                 (variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                                  *)local_248);
                    local_3c0._0_4_ = uVar14;
                    cVar37 = '\x01';
                    if (uVar14 != local_4d0) {
                      pmVar21 = std::
                                map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                                ::at((map<int,_optimization::global_expr_move::BlockOps,_std::less<int>,_std::allocator<std::pair<const_int,_optimization::global_expr_move::BlockOps>_>_>
                                      *)(env + 2),(key_type *)local_3c0);
                      pmVar22 = std::
                                map<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId,_std::less<std::pair<mir::inst::VarId,_mir::inst::Value>_>,_std::allocator<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_>
                                ::at(&pmVar21->loads,(key_type *)local_458);
                      local_390._0_8_ = &PTR_display_001ee058;
                      local_390._8_4_ = pmVar22->id;
                      pmVar15 = std::
                                map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                ::at(pmVar32,(key_type_conflict *)(local_390 + 8));
                      cVar37 = pmVar15->is_phi_var;
                      if ((bool)cVar37 == false) {
                        local_290.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001ee058;
                        local_290.id = *(uint32_t *)
                                        ((long)*(tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                                 *)&(local_4c8->_M_t)._M_impl + 0x10);
                        local_2a0.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001ee058;
                        local_2a0.id = local_390._8_4_;
                        var_replace::Var_Replace::replace
                                  ((Var_Replace *)local_1f8,&local_290,&local_2a0);
                        pmVar32 = local_4c8;
                        _Var27._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
                             *(tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> *)
                              &(local_4c8->_M_t)._M_impl;
                        _Var23._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
                             (tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
                             operator_new(0x38);
                        uVar2 = *(undefined4 *)
                                 ((long)_Var27._M_t.
                                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                        _M_head_impl + 0x10);
                        *(undefined ***)
                         ((long)_Var23._M_t.
                                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8) =
                             &PTR_display_001ee058;
                        *(undefined4 *)
                         ((long)_Var23._M_t.
                                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x10
                         ) = uVar2;
                        *(undefined ***)
                         _Var23._M_t.
                         super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                         .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = local_3d0;
                        *(undefined1 *)
                         ((long)_Var23._M_t.
                                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x30
                         ) = 0;
                        *(undefined4 *)
                         ((long)_Var23._M_t.
                                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x20
                         ) = 0xfffffc19;
                        *(pair<int,_int> *)
                         ((long)_Var23._M_t.
                                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x18
                         ) = local_490;
                        *(undefined2 *)
                         ((long)_Var23._M_t.
                                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x31
                         ) = 1;
                        _Var27._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
                             *(tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> *)
                              &(pmVar32->_M_t)._M_impl;
                        *(tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> *)
                         &(pmVar32->_M_t)._M_impl =
                             _Var23._M_t.
                             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                             .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
                        if ((_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                             )_Var27._M_t.
                              super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                              .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl !=
                            (Inst *)0x0) {
                          (**(code **)(*(long *)_Var27._M_t.
                                                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                                .super__Head_base<0UL,_mir::inst::Inst_*,_false>.
                                                _M_head_impl + 0x28))();
                        }
                        pmVar32 = local_498;
                        local_480 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT44(local_480._4_4_,local_390._8_4_);
                        pmVar15 = std::
                                  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                  ::at(local_498,(key_type_conflict *)&local_480);
                        pmVar15->is_temp_var = false;
                        local_4b4 = (uint)CONCAT71((int7)((ulong)pmVar15 >> 8),1);
                      }
                    }
                    pmVar36 = local_4c8;
                    pmVar19 = local_4c0;
                    if (cVar37 == '\0') goto LAB_00131315;
                  }
LAB_00131311:
                  pmVar36 = (map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                             *)&(pmVar36->_M_t)._M_impl.super__Rb_tree_header;
                }
LAB_00131315:
              } while (pmVar36 !=
                       (map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                        *)(pmVar19->inst).
                          super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
            }
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_2d0,(int *)&local_4d0);
            p_Var28 = (pmVar19->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            while ((_Rb_tree_header *)p_Var28 !=
                   &(pmVar19->preceding)._M_t._M_impl.super__Rb_tree_header) {
              _Var3 = p_Var28[1]._M_color;
              p_Var18 = (_List_node_base *)operator_new(0x18);
              *(_Rb_tree_color *)&p_Var18[1]._M_next = _Var3;
              std::__detail::_List_node_base::_M_hook(p_Var18);
              local_4a0 = local_4a0 + 1;
              p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28);
              pmVar32 = local_498;
            }
          }
        } while ((undefined8 ********)local_4b0 != &local_4b0);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_2d0);
      func_00 = local_3d8;
      pppppppuVar7 = local_4b0;
      while ((undefined8 ********)pppppppuVar7 != &local_4b0) {
        pppppppuVar6 = (undefined8 *******)*pppppppuVar7;
        operator_delete(pppppppuVar7,0x18);
        pppppppuVar7 = pppppppuVar6;
      }
      std::
      _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
      ::~_Rb_tree(&local_1c0);
      std::
      _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                   *)(local_1f8 + 8));
      livevar_analyse::Livevar_Analyse::~Livevar_Analyse(&local_190);
    } while ((local_4b4 & 1) != 0);
  }
  return;
}

Assistant:

void optimize_func(mir::inst::MirFunction& func) {
    if (func.type->is_extern) {
      return;
    }

    auto& startblk = func.basic_blks.begin()->second;
    for (auto& blkpair : func.basic_blks) {
      auto& blk = blkpair.second;
      for (auto iter = blkpair.second.inst.begin();
           iter != blkpair.second.inst.end();) {
        auto& inst = *iter;
        if (inst->inst_kind() == mir::inst::InstKind::Ref) {
          auto& i = *inst;
          auto refinst = dynamic_cast<mir::inst::RefInst*>(&i);
          if (blk.id == startblk.id) {
            break;
          }
          func.variables.at(inst->dest.id).is_temp_var = false;
          startblk.inst.push_back(std::move(inst));
          iter = blk.inst.erase(iter);
        } else {
          iter++;
        }
      }
    }
    int cnt = 0;
    while (true) {
      bool modify = false;
      livevar_analyse::Livevar_Analyse lva(func);
      lva.build();
      var_replace::Var_Replace vp(func);
      env = std::make_shared<Env>(func, lva, vp, offset);
      std::list<mir::types::LabelId> queue;
      std::set<mir::types::LabelId> visited;
      auto iter = func.basic_blks.end();
      iter--;
      queue.push_back(iter->first);
      while (!queue.empty()) {
        auto start = queue.front();
        queue.pop_front();
        if (visited.count(start)) {
          continue;
        }

        auto& blk = func.basic_blks.at(start);
        {  // visit logic
          auto& block = blk;
          auto& blv = lva.livevars[start];
          auto& variables = func.variables;
          for (auto iter = block.inst.begin(); iter != block.inst.end();) {
            auto& inst = *iter;
            if (func.variables.at(inst->dest.id).is_phi_var) {
              iter++;
              continue;
            }
            auto kind = inst->inst_kind();
            auto& i = *inst;
            switch (kind) {
              case mir::inst::InstKind::Op: {
                auto opInst = dynamic_cast<mir::inst::OpInst*>(&i);
                if (opInst->lhs.is_immediate() && opInst->rhs.is_immediate()) {
                  break;
                }
                int id = -1;
                Op op(opInst->op, opInst->lhs, opInst->rhs);
                if (!opInst->lhs.is_immediate() &&
                    !opInst->rhs.is_immediate()) {
                  auto lhs = std::get<mir::inst::VarId>(opInst->lhs);
                  auto rhs = std::get<mir::inst::VarId>(opInst->rhs);
                  if (!blv->live_vars_in->count(lhs) ||
                      !blv->live_vars_in->count(rhs)) {
                    break;
                  }
                  id = bfs(start, op);
                } else if (!opInst->lhs.is_immediate()) {
                  auto lhs = std::get<mir::inst::VarId>(opInst->lhs);
                  if (!blv->live_vars_in->count(lhs)) {
                    break;
                  }
                  id = bfs(start, op);

                } else if (!opInst->rhs.is_immediate()) {
                  auto rhs = std::get<mir::inst::VarId>(opInst->rhs);
                  if (!blv->live_vars_in->count(rhs)) {
                    break;
                  }
                  id = bfs(start, op);
                }
                if (id == start) {
                  break;
                }
                auto var = env->blk_op_map.at(id).ops.at(op);
                if (func.variables.at(var.id).is_phi_var) {
                  vp.setdefpoint(inst->dest, id,
                                 func.basic_blks.at(id).inst.size());
                  for (auto var : inst->useVars()) {
                    auto& usepoints = vp.usepoints.at(var);
                    std::pair<mir::types::LabelId, int> point = {
                        blk.id, iter - block.inst.begin()};
                    auto find_iter =
                        std::find(usepoints.begin(), usepoints.end(), point);
                    if (find_iter != usepoints.end()) {
                      usepoints.erase(find_iter);
                      usepoints.push_back(
                          {id, func.basic_blks.at(id).inst.size()});
                    }
                  }
                  func.basic_blks.at(id).inst.push_back(std::move(inst));
                  inst = std::make_unique<mir::inst::AssignInst>(
                      mir::inst::VarId(-1), -1);
                } else {
                  LOG(TRACE)
                      << inst->dest << " is replaced to " << var << std::endl;
                  vp.replace(inst->dest, var);
                  // useless inst
                  inst =
                      std::make_unique<mir::inst::AssignInst>(inst->dest, -999);
                }
                func.variables.at(var).is_temp_var = false;
                modify = true;
                continue;
              }
              case mir::inst::InstKind::Load: {
                if (!offset) {
                  break;
                }
                auto loadInst = dynamic_cast<mir::inst::LoadOffsetInst*>(&i);
                LoadOp op = {{std::get<mir::inst::VarId>(loadInst->src),
                              loadInst->offset},
                             loadInst->dest};
                auto id = bfs(start, op);
                if (id == start) {
                  break;
                }
                auto var = env->blk_op_map.at(id).loads.at(op.first);
                if (!func.variables.at(var.id).is_phi_var) {
                  vp.replace(inst->dest, var);
                  // useless inst
                  inst =
                      std::make_unique<mir::inst::AssignInst>(inst->dest, -999);
                  func.variables.at(var).is_temp_var = false;
                  modify = true;
                  continue;
                } else {
                  break;
                }
              }
              // case mir::inst::InstKind::Store: {
              //   auto storeInst = dynamic_cast<mir::inst::StoreInst*>(&i);

              //   break;
              // }
              default:;
            }
            iter++;
          }
        }
        visited.insert(start);
        for (auto pre : blk.preceding) {
          queue.push_back(pre);
        }
      }
      if (!modify) {
        break;
      }
    }
  }